

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O1

char_t * pugi::impl::anon_unknown_0::
         strconv_attribute_impl<pugi::impl::(anonymous_namespace)::opt_true>::parse_simple
                   (char_t *s,char_t end_quote)

{
  byte bVar1;
  char_t *pcVar2;
  bool bVar3;
  gap g;
  gap local_38;
  
  local_38.end = (char_t *)0x0;
  local_38.size = 0;
  do {
    if (((anonymous_namespace)::chartype_table[*s] & 2) == 0) {
      if (((anonymous_namespace)::chartype_table[s[1]] & 2) != 0) {
        s = s + 1;
        goto LAB_0010cce3;
      }
      if (((anonymous_namespace)::chartype_table[s[2]] & 2) != 0) {
        s = s + 2;
        goto LAB_0010cce3;
      }
      bVar3 = ((anonymous_namespace)::chartype_table[s[3]] & 2) == 0;
      if (bVar3) {
        s = s + 4;
      }
      else {
        s = s + 3;
      }
    }
    else {
LAB_0010cce3:
      bVar3 = false;
    }
    if (!bVar3) {
      bVar1 = *s;
      if (bVar1 == end_quote) {
        pcVar2 = gap::flush(&local_38,s);
        *pcVar2 = '\0';
        return s + 1;
      }
      if (bVar1 == 0x26) {
        s = strconv_escape(s,&local_38);
      }
      else {
        if (bVar1 == 0) {
          return (char_t *)0x0;
        }
        s = s + 1;
      }
    }
  } while( true );
}

Assistant:

static char_t* parse_simple(char_t* s, char_t end_quote)
		{
			gap g;

			while (true)
			{
				PUGI__SCANWHILE_UNROLL(!PUGI__IS_CHARTYPE(ss, ct_parse_attr));

				if (*s == end_quote)
				{
					*g.flush(s) = 0;

					return s + 1;
				}
				else if (opt_escape::value && *s == '&')
				{
					s = strconv_escape(s, g);
				}
				else if (!*s)
				{
					return 0;
				}
				else ++s;
			}
		}